

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::WaitOrderStatementSyntax::setChild
          (WaitOrderStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  NamedLabelSyntax *pNVar2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *pSVar3;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar4;
  SyntaxNode *pSVar5;
  logic_error *this_00;
  Token TVar6;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 7) {
    switch(index) {
    case 0:
      pSVar5 = TokenOrSyntax::node(&child);
      if (pSVar5 == (SyntaxNode *)0x0) {
        pNVar2 = (NamedLabelSyntax *)0x0;
      }
      else {
        pSVar5 = TokenOrSyntax::node(&child);
        pNVar2 = SyntaxNode::as<slang::syntax::NamedLabelSyntax>(pSVar5);
      }
      (this->super_StatementSyntax).label = pNVar2;
      break;
    case 1:
      pSVar5 = TokenOrSyntax::node(&child);
      pSVar4 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                         (pSVar5);
      (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar4->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar4->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
           (pSVar4->super_SyntaxListBase).childCount;
      sVar1 = (pSVar4->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
              .size_;
      (this->super_StatementSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar4->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
           data_;
      (this->super_StatementSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 2:
      TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->wait_order).kind = TVar6.kind;
      (this->wait_order).field_0x2 = TVar6._2_1_;
      (this->wait_order).numFlags = (NumericTokenFlags)TVar6.numFlags.raw;
      (this->wait_order).rawLen = TVar6.rawLen;
      (this->wait_order).info = TVar6.info;
      break;
    case 3:
      TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->openParen).kind = TVar6.kind;
      (this->openParen).field_0x2 = TVar6._2_1_;
      (this->openParen).numFlags = (NumericTokenFlags)TVar6.numFlags.raw;
      (this->openParen).rawLen = TVar6.rawLen;
      (this->openParen).info = TVar6.info;
      break;
    case 4:
      pSVar5 = TokenOrSyntax::node(&child);
      pSVar3 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>>(pSVar5)
      ;
      (this->names).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar3->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->names).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar3->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->names).super_SyntaxListBase.childCount = (pSVar3->super_SyntaxListBase).childCount;
      sVar1 = (pSVar3->elements).size_;
      (this->names).elements.data_ = (pSVar3->elements).data_;
      (this->names).elements.size_ = sVar1;
      break;
    case 5:
      TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->closeParen).kind = TVar6.kind;
      (this->closeParen).field_0x2 = TVar6._2_1_;
      (this->closeParen).numFlags = (NumericTokenFlags)TVar6.numFlags.raw;
      (this->closeParen).rawLen = TVar6.rawLen;
      (this->closeParen).info = TVar6.info;
      break;
    case 6:
      pSVar5 = TokenOrSyntax::node(&child);
      if (pSVar5 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar5 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p =
             (pointer)SyntaxNode::as<slang::syntax::ActionBlockSyntax>(pSVar5);
      }
      not_null<slang::syntax::ActionBlockSyntax*>::not_null<slang::syntax::ActionBlockSyntax*,void>
                ((not_null<slang::syntax::ActionBlockSyntax*> *)&local_b8,
                 (ActionBlockSyntax **)&local_d8);
      (this->action).ptr = (ActionBlockSyntax *)local_b8._M_dataplus._M_p;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_58,&local_78,":");
  std::__cxx11::to_string(&local_98,0x3661);
  std::operator+(&local_38,&local_58,&local_98);
  std::operator+(&local_d8,&local_38,": ");
  std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void WaitOrderStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: wait_order = child.token(); return;
        case 3: openParen = child.token(); return;
        case 4: names = child.node()->as<SeparatedSyntaxList<NameSyntax>>(); return;
        case 5: closeParen = child.token(); return;
        case 6: action = child.node() ? &child.node()->as<ActionBlockSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}